

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V2_DimAngular::Write(ON_OBSOLETE_V2_DimAngular *this,ON_BinaryArchive *file)

{
  bool local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_OBSOLETE_V2_DimAngular *this_local;
  
  local_19 = ON_OBSOLETE_V2_Annotation::Write(&this->super_ON_OBSOLETE_V2_Annotation,file);
  if (local_19) {
    local_19 = ON_BinaryArchive::WriteDouble(file,this->m_angle);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteDouble(file,this->m_radius);
  }
  return local_19;
}

Assistant:

bool ON_OBSOLETE_V2_DimAngular::Write( ON_BinaryArchive& file ) const
{
  bool rc = ON_OBSOLETE_V2_Annotation::Write( file );
  if( rc )
    rc = file.WriteDouble( m_angle );
  if( rc )
    rc = file.WriteDouble( m_radius );
  return rc;
}